

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_stat.cpp
# Opt level: O1

void __thiscall csv::CSVStat::min_max(CSVStat *this,longdouble *x_n,size_t *i)

{
  longdouble *plVar1;
  longdouble lVar2;
  size_t sVar3;
  pointer plVar4;
  longdouble *plVar5;
  
  sVar3 = *i;
  plVar4 = (this->mins).super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
           super__Vector_impl_data._M_start;
  plVar5 = plVar4 + sVar3;
  if (NAN(plVar4[sVar3])) {
    *plVar5 = *x_n;
  }
  plVar4 = (this->maxes).super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
           super__Vector_impl_data._M_start;
  plVar1 = plVar4 + sVar3;
  if (NAN(plVar4[sVar3])) {
    *plVar1 = *x_n;
  }
  lVar2 = *x_n;
  if ((lVar2 < *plVar5) || (plVar5 = plVar1, *plVar1 < lVar2)) {
    *plVar5 = lVar2;
  }
  return;
}

Assistant:

CSV_INLINE void CSVStat::min_max(const long double &x_n, const size_t &i) {
        /** Update current minimum and maximum
         *  @param[in]  x_n Data observation
         *  @param[out] i   The column index that should be updated
         */
        if (std::isnan(this->mins[i]))
            this->mins[i] = x_n;
        if (std::isnan(this->maxes[i]))
            this->maxes[i] = x_n;
        
        if (x_n < this->mins[i])
            this->mins[i] = x_n;
        else if (x_n > this->maxes[i])
            this->maxes[i] = x_n;
    }